

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O1

Hop_Obj_t * Kit_GraphToHop(Hop_Man_t *pMan,Kit_Graph_t *pGraph)

{
  Kit_Node_t *pKVar1;
  Hop_Obj_t *pHVar2;
  long lVar3;
  long lVar4;
  
  if (0 < pGraph->nLeaves) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      pKVar1 = pGraph->pNodes;
      pHVar2 = Hop_IthVar(pMan,(int)lVar4);
      *(Hop_Obj_t **)(&(pKVar1->eEdge0).field_0x0 + lVar3) = pHVar2;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar4 < pGraph->nLeaves);
  }
  pHVar2 = Kit_GraphToHopInternal(pMan,pGraph);
  return pHVar2;
}

Assistant:

Hop_Obj_t * Kit_GraphToHop( Hop_Man_t * pMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    int i;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Hop_IthVar( pMan, i );
    // perform strashing
    return Kit_GraphToHopInternal( pMan, pGraph );
}